

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_fmax_a_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float_status *status_13;
  int32_t *piVar1;
  int iVar2;
  float32 fVar3;
  uint uVar4;
  float32 fVar5;
  uint uVar6;
  float32 fVar7;
  uint uVar8;
  float32 fVar9;
  float32 fVar10;
  fpr_t *pfVar11;
  float64 fVar12;
  float64 fVar13;
  float64 fVar14;
  float32 fVar15;
  fpr_t *pfVar16;
  float64 fVar17;
  ulong uVar18;
  float_status *status_9;
  float_status *status_12;
  float_status *status;
  float64 local_68;
  float64 local_60;
  float64 local_58;
  float64 local_50;
  float32 local_48;
  float32 local_40;
  
  status_13 = &(env->active_tc).msa_fp_status;
  pfVar16 = (env->active_fpu).fpr + ws;
  pfVar11 = (env->active_fpu).fpr + wt;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 3) {
    uVar18 = pfVar16->fd;
    fVar12 = pfVar11->fd;
    local_60 = uVar18 & 0x7fffffffffffffff;
    if (((0x7ff0000000000000 < local_60) ||
        (iVar2 = float64_is_quiet_nan_mips64el(fVar12,status_13), fVar17 = uVar18,
        local_58 = local_60, iVar2 == 0)) &&
       (local_58 = fVar12 & 0x7fffffffffffffff, fVar17 = fVar12, local_58 < 0x7ff0000000000001)) {
      iVar2 = float64_is_quiet_nan_mips64el(uVar18,status_13);
      if (iVar2 != 0) {
        uVar18 = fVar12;
      }
      local_60 = uVar18 & 0x7fffffffffffffff;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar12 = float64_max_mips64el(uVar18,fVar17,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar12 = float64_default_nan_mips64el(status_13);
      fVar12 = (long)(int)uVar6 | fVar12 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar17 = float64_min_mips64el(uVar18,fVar17,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar17 = float64_default_nan_mips64el(status_13);
      fVar17 = (long)(int)uVar6 | fVar17 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar13 = float64_max_mips64el(local_60,local_58,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar13 = float64_default_nan_mips64el(status_13);
      fVar13 = (long)(int)uVar6 | fVar13 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    if (fVar13 == (fVar12 & 0x7fffffffffffffff)) {
      fVar17 = fVar12;
    }
    if (local_60 == local_58) {
      fVar17 = fVar12;
    }
    uVar18 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    fVar12 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    local_68 = uVar18 & 0x7fffffffffffffff;
    if (((0x7ff0000000000000 < local_68) ||
        (iVar2 = float64_is_quiet_nan_mips64el(fVar12,status_13), fVar13 = uVar18,
        local_50 = local_68, iVar2 == 0)) &&
       (local_50 = fVar12 & 0x7fffffffffffffff, fVar13 = fVar12, local_50 < 0x7ff0000000000001)) {
      iVar2 = float64_is_quiet_nan_mips64el(uVar18,status_13);
      if (iVar2 != 0) {
        uVar18 = fVar12;
      }
      local_68 = uVar18 & 0x7fffffffffffffff;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar12 = float64_max_mips64el(uVar18,fVar13,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar12 = float64_default_nan_mips64el(status_13);
      fVar12 = (long)(int)uVar6 | fVar12 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar13 = float64_min_mips64el(uVar18,fVar13,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar13 = float64_default_nan_mips64el(status_13);
      fVar13 = (long)(int)uVar6 | fVar13 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar14 = float64_max_mips64el(local_68,local_50,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar14 = float64_default_nan_mips64el(status_13);
      fVar14 = (long)(int)uVar6 | fVar14 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    if ((local_68 != local_50) && (fVar14 != (fVar12 & 0x7fffffffffffffff))) {
      fVar12 = fVar13;
    }
  }
  else {
    if (df != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1ada,
                    "void helper_msa_fmax_a_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    uVar6 = pfVar16->fs[0];
    fVar3 = pfVar11->fs[0];
    uVar8 = uVar6 & 0x7fffffff;
    if (((0x7f800000 < (uVar6 & 0x7fffffff)) ||
        (iVar2 = float32_is_quiet_nan_mips64el(fVar3,status_13), fVar5 = uVar6,
        local_58._0_4_ = uVar8, iVar2 == 0)) &&
       (fVar5 = fVar3, local_58._0_4_ = fVar3 & 0x7fffffff, (fVar3 & 0x7fffffff) < 0x7f800001)) {
      iVar2 = float32_is_quiet_nan_mips64el(uVar6,status_13);
      if (iVar2 != 0) {
        uVar6 = fVar3;
      }
      uVar8 = uVar6 & 0x7fffffff;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar3 = float32_max_mips64el(uVar6,fVar5,status_13);
    uVar4 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar4) != 0) {
      fVar3 = float32_default_nan_mips64el(status_13);
      fVar3 = fVar3 & 0xffffffc0 ^ 0x400000 | uVar4;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar5 = float32_min_mips64el(uVar6,fVar5,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar5 = float32_default_nan_mips64el(status_13);
      fVar5 = fVar5 & 0xffffffc0 ^ 0x400000 | uVar6;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar7 = float32_max_mips64el(uVar8,(uint)local_58,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar7 = float32_default_nan_mips64el(status_13);
      fVar7 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar6;
    }
    if (fVar7 == (fVar3 & 0x7fffffff)) {
      fVar5 = fVar3;
    }
    if (uVar8 == (uint)local_58) {
      fVar5 = fVar3;
    }
    fVar3 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    fVar7 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar6 = fVar3 & 0x7fffffff;
    if (((0x7f800000 < (fVar3 & 0x7fffffff)) ||
        (iVar2 = float32_is_quiet_nan_mips64el(fVar7,status_13), fVar9 = fVar3,
        local_58._0_4_ = uVar6, iVar2 == 0)) &&
       (local_58._0_4_ = fVar7 & 0x7fffffff, fVar9 = fVar7, (fVar7 & 0x7fffffff) < 0x7f800001)) {
      iVar2 = float32_is_quiet_nan_mips64el(fVar3,status_13);
      if (iVar2 != 0) {
        fVar3 = fVar7;
      }
      uVar6 = fVar3 & 0x7fffffff;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar7 = float32_max_mips64el(fVar3,fVar9,status_13);
    uVar8 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar8) != 0) {
      fVar7 = float32_default_nan_mips64el(status_13);
      fVar7 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar8;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar3 = float32_min_mips64el(fVar3,fVar9,status_13);
    uVar8 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar8) != 0) {
      fVar3 = float32_default_nan_mips64el(status_13);
      fVar3 = fVar3 & 0xffffffc0 ^ 0x400000 | uVar8;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar9 = float32_max_mips64el(uVar6,(uint)local_58,status_13);
    uVar8 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar8) != 0) {
      fVar9 = float32_default_nan_mips64el(status_13);
      fVar9 = fVar9 & 0xffffffc0 ^ 0x400000 | uVar8;
    }
    if (fVar9 == (fVar7 & 0x7fffffff)) {
      fVar3 = fVar7;
    }
    if (uVar6 == (uint)local_58) {
      fVar3 = fVar7;
    }
    fVar7 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    fVar9 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    fVar15 = fVar7 & 0x7fffffff;
    if (((0x7f800000 < fVar15) ||
        (iVar2 = float32_is_quiet_nan_mips64el(fVar9,status_13), fVar10 = fVar7, local_40 = fVar15,
        iVar2 == 0)) && (local_40 = fVar9 & 0x7fffffff, fVar10 = fVar9, local_40 < 0x7f800001)) {
      iVar2 = float32_is_quiet_nan_mips64el(fVar7,status_13);
      if (iVar2 != 0) {
        fVar7 = fVar9;
      }
      fVar15 = fVar7 & 0x7fffffff;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar9 = float32_max_mips64el(fVar7,fVar10,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar9 = float32_default_nan_mips64el(status_13);
      fVar9 = fVar9 & 0xffffffc0 ^ 0x400000 | uVar6;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar7 = float32_min_mips64el(fVar7,fVar10,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar7 = float32_default_nan_mips64el(status_13);
      fVar7 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar6;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar10 = float32_max_mips64el(fVar15,local_40,status_13);
    uVar6 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
      fVar10 = float32_default_nan_mips64el(status_13);
      fVar10 = fVar10 & 0xffffffc0 ^ 0x400000 | uVar6;
    }
    if (fVar10 == (fVar9 & 0x7fffffff)) {
      fVar7 = fVar9;
    }
    if (fVar15 == local_40) {
      fVar7 = fVar9;
    }
    fVar9 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    fVar15 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    uVar6 = fVar9 & 0x7fffffff;
    if (((0x7f800000 < (fVar9 & 0x7fffffff)) ||
        (iVar2 = float32_is_quiet_nan_mips64el(fVar15,status_13), fVar10 = fVar9, local_48 = uVar6,
        iVar2 == 0)) &&
       (fVar10 = fVar15, local_48 = fVar15 & 0x7fffffff, (fVar15 & 0x7fffffff) < 0x7f800001)) {
      iVar2 = float32_is_quiet_nan_mips64el(fVar9,status_13);
      if (iVar2 != 0) {
        fVar9 = fVar15;
      }
      uVar6 = fVar9 & 0x7fffffff;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar15 = float32_max_mips64el(fVar9,fVar10,status_13);
    uVar8 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar8) != 0) {
      fVar15 = float32_default_nan_mips64el(status_13);
      fVar15 = fVar15 & 0xffffffc0 ^ 0x400000 | uVar8;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar9 = float32_min_mips64el(fVar9,fVar10,status_13);
    uVar8 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar8) != 0) {
      fVar9 = float32_default_nan_mips64el(status_13);
      fVar9 = fVar9 & 0xffffffc0 ^ 0x400000 | uVar8;
    }
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar10 = float32_max_mips64el(uVar6,local_48,status_13);
    uVar8 = update_msacsr(env,0,0);
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar8) != 0) {
      fVar10 = float32_default_nan_mips64el(status_13);
      fVar10 = fVar10 & 0xffffffc0 ^ 0x400000 | uVar8;
    }
    fVar17 = CONCAT44(fVar3,fVar5);
    if (fVar10 == (fVar15 & 0x7fffffff)) {
      fVar9 = fVar15;
    }
    if (uVar6 == local_48) {
      fVar9 = fVar15;
    }
    fVar12 = CONCAT44(fVar9,fVar7);
  }
  check_msacsr_cause(env,(uintptr_t)status);
  (env->active_fpu).fpr[wd].fd = fVar17;
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = fVar12;
  return;
}

Assistant:

void helper_msa_fmax_a_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    float_status *status = &env->active_tc.msa_fp_status;
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    clear_msacsr_cause(env);

    if (df == DF_WORD) {
        FMAXMIN_A(max, min, pwx->w[0], pws->w[0], pwt->w[0], 32, status);
        FMAXMIN_A(max, min, pwx->w[1], pws->w[1], pwt->w[1], 32, status);
        FMAXMIN_A(max, min, pwx->w[2], pws->w[2], pwt->w[2], 32, status);
        FMAXMIN_A(max, min, pwx->w[3], pws->w[3], pwt->w[3], 32, status);
    } else if (df == DF_DOUBLE) {
        FMAXMIN_A(max, min, pwx->d[0], pws->d[0], pwt->d[0], 64, status);
        FMAXMIN_A(max, min, pwx->d[1], pws->d[1], pwt->d[1], 64, status);
    } else {
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}